

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

size_t __thiscall QPDFWriter::calculateXrefStreamPadding(QPDFWriter *this,qpdf_offset_t xref_bytes)

{
  size_t sVar1;
  long local_20;
  qpdf_offset_t local_18;
  qpdf_offset_t xref_bytes_local;
  QPDFWriter *this_local;
  
  local_20 = ((xref_bytes + 0x3fff) / 0x4000) * 5 + 0x10;
  local_18 = xref_bytes;
  xref_bytes_local = (qpdf_offset_t)this;
  sVar1 = QIntC::to_size<long_long>(&local_20);
  return sVar1;
}

Assistant:

size_t
QPDFWriter::calculateXrefStreamPadding(qpdf_offset_t xref_bytes)
{
    // This routine is called right after a linearization first pass xref stream has been written
    // without compression.  Calculate the amount of padding that would be required in the worst
    // case, assuming the number of uncompressed bytes remains the same. The worst case for zlib is
    // that the output is larger than the input by 6 bytes plus 5 bytes per 16K, and then we'll add
    // 10 extra bytes for number length increases.

    return QIntC::to_size(16 + (5 * ((xref_bytes + 16383) / 16384)));
}